

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

void Abc_NtkMultiCone_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vCone_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMulti.c"
                  ,0x26a,"void Abc_NtkMultiCone_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if (((*(uint *)&pNode->field_0x14 >> 4 & 1) == 0) && (iVar1 = Abc_ObjIsNode(pNode), iVar1 != 0)) {
    pAVar2 = Abc_ObjFanin(pNode,0);
    Abc_NtkMultiCone_rec(pAVar2,vCone);
    pAVar2 = Abc_ObjFanin(pNode,1);
    Abc_NtkMultiCone_rec(pAVar2,vCone);
    return;
  }
  Vec_PtrPushUnique(vCone,pNode);
  return;
}

Assistant:

void Abc_NtkMultiCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->fMarkA || !Abc_ObjIsNode(pNode) )
    {
        Vec_PtrPushUnique( vCone, pNode );
        return;
    }
    Abc_NtkMultiCone_rec( Abc_ObjFanin(pNode,0), vCone );
    Abc_NtkMultiCone_rec( Abc_ObjFanin(pNode,1), vCone );
}